

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.hxx
# Opt level: O2

string * __thiscall
cmsys::RegularExpression::match_abi_cxx11_
          (string *__return_storage_ptr__,RegularExpression *this,int n)

{
  char *pcVar1;
  char *pcVar2;
  allocator local_9;
  
  pcVar1 = this->startp[n];
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_9);
  }
  else {
    pcVar2 = this->endp[n];
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar1,pcVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string RegularExpression::match(int n) const
{
  if (this->startp[n] == 0) {
    return std::string("");
  } else {
    return std::string(this->startp[n], static_cast<std::string::size_type>(
                                          this->endp[n] - this->startp[n]));
  }
}